

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

Vector<float,_4> __thiscall
tcu::lookup<float>(tcu *this,ConstPixelBufferAccess *access,Sampler *sampler,int i,int j,int k)

{
  bool bVar1;
  TextureFormat *pTVar2;
  undefined8 extraout_XMM0_Qa;
  undefined8 uVar3;
  Vec4 VVar4;
  Vector<float,_4> VVar5;
  Vector<float,_4> VVar6;
  undefined1 local_3c [8];
  Vec4 p;
  int k_local;
  int j_local;
  int i_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *access_local;
  undefined1 auVar7 [12];
  undefined8 uVar8;
  
  p.m_data[2] = (float)k;
  p.m_data[3] = (float)j;
  bVar1 = coordsInBounds(access,i,j,k);
  if (bVar1) {
    VVar4 = ConstPixelBufferAccess::getPixel
                      ((ConstPixelBufferAccess *)local_3c,(int)access,i,(int)p.m_data[3]);
    uVar3 = VVar4.m_data._8_8_;
    pTVar2 = ConstPixelBufferAccess::getFormat(access);
    bVar1 = isSRGB(*pTVar2);
    if (bVar1) {
      VVar5.m_data = (float  [4])sRGBToLinear(this,(Vec4 *)local_3c);
    }
    else {
      Vector<float,_4>::Vector((Vector<float,_4> *)this,(Vector<float,_4> *)local_3c);
      VVar5.m_data[2] = (float)(int)uVar3;
      VVar5.m_data[3] = (float)(int)((ulong)uVar3 >> 0x20);
      VVar5.m_data[0] = (float)(int)extraout_XMM0_Qa;
      VVar5.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
    }
  }
  else {
    pTVar2 = ConstPixelBufferAccess::getFormat(access);
    VVar5 = sampleTextureBorder<float>(this,pTVar2,sampler);
  }
  VVar6.m_data[0] = VVar5.m_data[0];
  auVar7._4_4_ = VVar5.m_data[1];
  register0x00001240 = VVar5.m_data[2];
  register0x00001244 = VVar5.m_data[3];
  return (Vector<float,_4>)VVar6.m_data;
}

Assistant:

inline Vector<float, 4> lookup (const ConstPixelBufferAccess& access, const Sampler& sampler, int i, int j, int k)
{
	// Specialization for float lookups: sRGB conversion is performed as specified in format.
	if (coordsInBounds(access, i, j, k))
	{
		const Vec4 p = access.getPixel(i, j, k);
		return isSRGB(access.getFormat()) ? sRGBToLinear(p) : p;
	}
	else
		return sampleTextureBorder<float>(access.getFormat(), sampler);
}